

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall
crnlib::mip_level::pack_to_dxt
          (mip_level *this,image_u8 *img,pixel_format fmt,bool cook,pack_params *orig_params,
          orientation_flags_t orient_flags)

{
  bool bVar1;
  int iVar2;
  component_flags cVar3;
  dxt_format dVar4;
  uint uVar5;
  dxt_image *this_00;
  dxt_image *pDXT_image;
  dxt_format dxt_fmt;
  undefined1 local_a0 [8];
  image_u8 tmp_img;
  pack_params p;
  orientation_flags_t orient_flags_local;
  pack_params *orig_params_local;
  bool cook_local;
  pixel_format fmt_local;
  image_u8 *img_local;
  mip_level *this_local;
  
  iVar2 = pixel_format_helpers::is_dxt(fmt);
  if (iVar2 == 0) {
    this_local._7_1_ = false;
  }
  else {
    memcpy(&tmp_img.m_pixel_buf.m_size,orig_params,0x38);
    bVar1 = pixel_format_helpers::is_pixel_format_non_srgb(fmt);
    if ((!bVar1) &&
       (cVar3 = image<crnlib::color_quad<unsigned_char,_int>_>::get_comp_flags(img),
       (cVar3 & cCompFlagNormalMap) == 0)) {
      image<crnlib::color_quad<unsigned_char,_int>_>::get_comp_flags(img);
    }
    image<crnlib::color_quad<unsigned_char,_int>_>::image
              ((image<crnlib::color_quad<unsigned_char,_int>_> *)local_a0,img);
    clear(this);
    this->m_format = fmt;
    if (cook) {
      cook_image(this,(image_u8 *)local_a0);
    }
    bVar1 = pixel_format_helpers::is_alpha_only(fmt);
    if ((bVar1) &&
       (bVar1 = image<crnlib::color_quad<unsigned_char,_int>_>::has_alpha
                          ((image<crnlib::color_quad<unsigned_char,_int>_> *)local_a0), !bVar1)) {
      image<crnlib::color_quad<unsigned_char,_int>_>::set_alpha_to_luma
                ((image<crnlib::color_quad<unsigned_char,_int>_> *)local_a0);
    }
    dVar4 = pixel_format_helpers::get_dxt_format(fmt);
    this_00 = crnlib_new<crnlib::dxt_image>();
    uVar5 = dxt_image::init(this_00,(EVP_PKEY_CTX *)(ulong)(uint)dVar4);
    this_local._7_1_ = (uVar5 & 1) != 0;
    if (this_local._7_1_) {
      assign(this,this_00,fmt,orient_flags);
    }
    else {
      clear(this);
    }
    image<crnlib::color_quad<unsigned_char,_int>_>::~image
              ((image<crnlib::color_quad<unsigned_char,_int>_> *)local_a0);
  }
  return this_local._7_1_;
}

Assistant:

bool mip_level::pack_to_dxt(const image_u8& img, pixel_format fmt, bool cook, const dxt_image::pack_params& orig_params, orientation_flags_t orient_flags) {
  CRNLIB_ASSERT(pixel_format_helpers::is_dxt(fmt));
  if (!pixel_format_helpers::is_dxt(fmt))
    return false;

  dxt_image::pack_params p(orig_params);
  if (pixel_format_helpers::is_pixel_format_non_srgb(fmt) || (img.get_comp_flags() & pixel_format_helpers::cCompFlagNormalMap) || (img.get_comp_flags() & pixel_format_helpers::cCompFlagLumaChroma)) {
    // Disable perceptual colorspace metrics when packing to swizzled or non-RGB pixel formats.
    p.m_perceptual = false;
  }

  image_u8 tmp_img(img);

  clear();

  m_format = fmt;

  if (cook)
    cook_image(tmp_img);

  if ((pixel_format_helpers::is_alpha_only(fmt)) && (!tmp_img.has_alpha()))
    tmp_img.set_alpha_to_luma();

  dxt_format dxt_fmt = pixel_format_helpers::get_dxt_format(fmt);

  dxt_image* pDXT_image = crnlib_new<dxt_image>();
  if (!pDXT_image->init(dxt_fmt, tmp_img, p)) {
    clear();
    return false;
  }

  assign(pDXT_image, fmt, orient_flags);

  return true;
}